

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_group.cpp
# Opt level: O1

void resize_group_parts(Am_Slot first_invalidated)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  Am_Value *pAVar7;
  Am_Object self;
  Am_Value_List parts;
  Am_Object part;
  Am_Object local_68;
  int local_60;
  int local_5c;
  float local_58;
  float local_54;
  Am_Value_List local_50;
  Am_Object local_40 [2];
  
  local_68.data = (Am_Object_Data *)0x0;
  Am_Slot::Get_Owner((Am_Slot *)&local_50);
  Am_Object::operator=(&local_68,(Am_Object *)&local_50);
  Am_Object::~Am_Object((Am_Object *)&local_50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"resize of ",10);
  poVar6 = operator<<((ostream *)&std::cout,&local_68);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::ostream::flush();
  pAVar7 = Am_Object::Get(&local_68,0x7df,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_68,0x7e0,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_68,0x66,0);
  local_5c = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&local_68,0x67,0);
  local_60 = Am_Value::operator_cast_to_int(pAVar7);
  if (iVar3 != 0 && iVar2 != 0) {
    local_5c = local_5c + (uint)(local_5c == 0);
    local_60 = local_60 + (uint)(local_60 == 0);
    Am_Value_List::Am_Value_List(&local_50);
    pAVar7 = Am_Object::Get(&local_68,0x82,0);
    Am_Value_List::operator=(&local_50,pAVar7);
    local_40[0].data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&local_50);
    local_54 = (float)local_5c / (float)iVar2;
    local_58 = (float)local_60 / (float)iVar3;
    while( true ) {
      bVar1 = Am_Value_List::Last(&local_50);
      if (bVar1) break;
      pAVar7 = Am_Value_List::Get(&local_50);
      Am_Object::operator=(local_40,pAVar7);
      pAVar7 = Am_Object::Get(local_40,100,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(local_40,0x65,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(local_40,0x67,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(local_40,0x66,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar7);
      Am_Object::Set(local_40,100,(int)((float)iVar2 * local_54),0);
      Am_Object::Set(local_40,0x66,(int)((float)iVar5 * local_54),0);
      Am_Object::Set(local_40,0x65,(int)((float)iVar3 * local_58),0);
      Am_Object::Set(local_40,0x67,(int)((float)iVar4 * local_58),0);
      Am_Value_List::Next(&local_50);
    }
    Am_Object::~Am_Object(local_40);
    Am_Value_List::~Am_Value_List(&local_50);
  }
  Am_Object::Set(&local_68,0x7e0,local_60,0);
  Am_Object::Set(&local_68,0x7df,local_5c,0);
  Am_Object::~Am_Object(&local_68);
  return;
}

Assistant:

static void
resize_group_parts(Am_Slot first_invalidated)
{
  Am_Object self;
  self = first_invalidated.Get_Owner();
  std::cout << "resize of " << self << std::endl << std::flush;
  int old_width, old_height, new_width, new_height;
  float width_ratio, height_ratio;
  old_width = self.Get(Am_OLD_WIDTH);
  old_height = self.Get(Am_OLD_HEIGHT);
  new_width = self.Get(Am_WIDTH);
  new_height = self.Get(Am_HEIGHT);
  if (old_width && old_height) { //otherwise, first time changed
    if (new_width == 0)
      new_width = 1;
    if (new_height == 0)
      new_height = 1;
    width_ratio = (float)new_width / (float)old_width;
    height_ratio = (float)new_height / (float)old_height;
    Am_Value_List parts;
    parts = self.Get(Am_GRAPHICAL_PARTS);
    Am_Object part;
    for (parts.Start(); !parts.Last(); parts.Next()) {
      part = parts.Get();
      int left = (int)part.Get(Am_LEFT);
      int top = (int)part.Get(Am_TOP);
      int height = (int)part.Get(Am_HEIGHT);
      int width = (int)part.Get(Am_WIDTH);
      part.Set(Am_LEFT, (int)(left * width_ratio));
      part.Set(Am_WIDTH, (int)(width * width_ratio));
      part.Set(Am_TOP, (int)(top * height_ratio));
      part.Set(Am_HEIGHT, (int)(height * height_ratio));
    }
  }
  self.Set(Am_OLD_HEIGHT, new_height);
  self.Set(Am_OLD_WIDTH, new_width);
}